

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.cpp
# Opt level: O0

VMatrix * __thiscall
rlottie::internal::model::Repeater::Transform::matrix(Transform *this,int frameNo,float multiplier)

{
  VPointF pos;
  VMatrix *in_RDI;
  uint in_XMM0_Da;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  undefined4 extraout_XMM0_Db_00;
  Axis unaff_retaddr;
  float unaff_retaddr_00;
  VMatrix *in_stack_00000008;
  VMatrix *m;
  VPointF scale;
  VPointF *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  VPointF *this_00;
  int frameNo_00;
  VMatrix *this_01;
  VPointF in_stack_ffffffffffffff80;
  VPointF local_18;
  uint local_10;
  
  this_01 = in_RDI;
  local_10 = in_XMM0_Da;
  Property<VPointF,_void>::value
            ((Property<VPointF,_void> *)in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  local_18 = operator/(in_stack_ffffffffffffff68,0.0);
  this_00 = &local_18;
  fVar1 = VPointF::x(this_00);
  dVar2 = std::pow((double)CONCAT44(extraout_XMM0_Db,fVar1),(double)(ulong)local_10);
  VPointF::setX(this_00,SUB84(dVar2,0));
  fVar1 = VPointF::y(this_00);
  dVar2 = std::pow((double)CONCAT44(extraout_XMM0_Db_00,fVar1),(double)(ulong)local_10);
  VPointF::setY(this_00,SUB84(dVar2,0));
  frameNo_00 = (int)((ulong)this_00 >> 0x20);
  VMatrix::VMatrix(this_01);
  Property<VPointF,_void>::value((Property<VPointF,_void> *)this_01,frameNo_00);
  ::operator*(in_stack_ffffffffffffff68,0.0);
  pos = (VPointF)VMatrix::translate(this_01,in_stack_ffffffffffffff80);
  Property<VPointF,_void>::value((Property<VPointF,_void> *)this_01,frameNo_00);
  VMatrix::translate(this_01,pos);
  VMatrix::scale(this_01,pos);
  Property<float,_void>::value((Property<float,_void> *)pos,(int)((ulong)this_01 >> 0x20));
  VMatrix::rotate(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  Property<VPointF,_void>::value((Property<VPointF,_void> *)this_01,frameNo_00);
  VPointF::operator-(in_stack_ffffffffffffff68);
  VMatrix::translate(this_01,pos);
  return in_RDI;
}

Assistant:

VMatrix model::Repeater::Transform::matrix(int frameNo, float multiplier) const
{
    VPointF scale = mScale.value(frameNo) / 100.f;
    scale.setX(std::pow(scale.x(), multiplier));
    scale.setY(std::pow(scale.y(), multiplier));
    VMatrix m;
    m.translate(mPosition.value(frameNo) * multiplier)
        .translate(mAnchor.value(frameNo))
        .scale(scale)
        .rotate(mRotation.value(frameNo) * multiplier)
        .translate(-mAnchor.value(frameNo));

    return m;
}